

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::measure_environment<std::chrono::_V2::steady_clock>(void)

{
  int iterations;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  undefined1 local_50 [8];
  EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> cost;
  EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> resolution;
  int iters;
  
  if (measure_environment<std::chrono::_V2::steady_clock>::env ==
      (Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)0x0) {
    iterations = warmup<std::chrono::_V2::steady_clock>();
    estimate_clock_resolution<std::chrono::_V2::steady_clock>
              ((EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
               &cost.outliers.high_severe,iterations);
    estimate_clock_cost<std::chrono::_V2::steady_clock>
              ((EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
               local_50,(FloatDuration<std::chrono::_V2::steady_clock>)cost._24_8_);
    measure_environment<std::chrono::_V2::steady_clock>::env =
         (Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
         operator_new(0x40);
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).mean.__r =
         (rep)cost._24_8_;
    *(rep *)&(measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers =
         resolution.mean.__r;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.low_mild =
         resolution.outliers.samples_seen;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.high_mild
         = resolution.outliers.low_severe;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_resolution).outliers.
    high_severe = resolution.outliers.low_mild;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).mean.__r = (rep)local_50;
    *(rep *)&(measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers =
         cost.mean.__r;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.low_mild =
         cost.outliers.samples_seen;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.high_mild =
         cost.outliers.low_severe;
    (measure_environment<std::chrono::_V2::steady_clock>::env->clock_cost).outliers.high_severe =
         cost.outliers.low_mild;
    memcpy(in_RDI,measure_environment<std::chrono::_V2::steady_clock>::env,0x40);
  }
  else {
    memcpy(in_RDI,measure_environment<std::chrono::_V2::steady_clock>::env,0x40);
  }
  return in_RDI;
}

Assistant:

Environment<FloatDuration<Clock>> measure_environment() {
                static Environment<FloatDuration<Clock>>* env = nullptr;
                if (env) {
                    return *env;
                }

                auto iters = Detail::warmup<Clock>();
                auto resolution = Detail::estimate_clock_resolution<Clock>(iters);
                auto cost = Detail::estimate_clock_cost<Clock>(resolution.mean);

                env = new Environment<FloatDuration<Clock>>{ resolution, cost };
                return *env;
            }